

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

void IOcontroller::write_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  Nodelist vecSeed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  ofstream outFile;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&vecSeed,&resultObj->__VecSeed);
  mkdir_absence((outFolder->_M_dataplus)._M_p);
  std::operator+(&outpath,outFolder,"/seed");
  mkdir_absence(outpath._M_dataplus._M_p);
  std::operator+(&local_290,&outpath,"/seed_");
  std::operator+(&local_270,&local_290,outFileName);
  std::ofstream::ofstream(&outFile,(string *)&local_270,_S_out);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)vecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&outFile);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outFile);
  std::__cxx11::string::~string((string *)&outpath);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

static void write_order_seeds(const std::string& outFileName, const TResult& resultObj,
            const std::string& outFolder, const Graph & graph)
    {
        auto vecSeed = resultObj.get_seed_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile(outpath + "/seed_" + outFileName);
        for (auto i = 0; i < vecSeed.size(); i++)
        {
            outFile << vecSeed[i] << " " << graph[i].size() << '\n';
        }
        outFile.close();
    }